

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O2

uint Kernel::
     FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
     Bucket::hash(Term *t)

{
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  uint unaff_EBP;
  byte bVar4;
  byte local_40 [4];
  uint local_3c;
  byte local_38 [4];
  uint local_34;
  uint local_30;
  uint local_2c;
  
  NumTraits<Kernel::RationalConstantType>::
  ifLinMul<Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket::hash(Kernel::Term*)::_lambda(auto:1&,auto:2)_1_>
            (local_38,t);
  NumTraits<Kernel::RationalConstantType>::
  ifFloor<Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket::hash(Kernel::Term*)::_lambda(auto:1)_1_>
            (local_40,t);
  if (local_38[0] == 0) {
    if (local_40[0] != 1) {
      bVar1 = false;
      bVar4 = local_40[0];
      goto LAB_004b394b;
    }
    puVar3 = &local_3c;
    local_38[0] = local_40[0];
  }
  else {
    puVar3 = &local_34;
  }
  unaff_EBP = *puVar3;
  bVar1 = true;
  bVar4 = local_38[0];
LAB_004b394b:
  NumTraits<Kernel::RationalConstantType>::
  ifAdd<Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket::hash(Kernel::Term*)::_lambda(auto:1,auto:2)_1_>
            (&local_30,t);
  if (!bVar1) {
    unaff_EBP = local_2c;
  }
  uVar2 = (uint)bVar4;
  if (!bVar1) {
    uVar2 = local_30;
  }
  if ((uVar2 & 1) == 0) {
    unaff_EBP = t->_functor * 2;
  }
  return unaff_EBP;
}

Assistant:

static unsigned hash(Term* t) { 
      return ASig::ifLinMul(t, [](auto& k, auto t) { return hash(t.term()); })
          || ASig::ifFloor(t, [](auto t) { return 2 * hash(t.term()) + 1; })
          || ASig::ifAdd(t, [](auto l, auto r) { return hash(l.term()) + hash(r.term()); })
          || [&]() { return 2 * t->functor(); };
    }